

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

DVector3 * __thiscall
AActor::GetPortalTransition
          (DVector3 *__return_storage_ptr__,AActor *this,double byoffset,sector_t **pSec)

{
  double dVar1;
  sector_t_conflict *psVar2;
  bool bVar3;
  double local_78;
  DVector3 local_68;
  double local_48;
  double dStack_40;
  
  psVar2 = (sector_t_conflict *)this->Sector;
  local_78 = (this->__Pos).Z;
  dVar1 = byoffset + local_78;
  local_48 = (this->__Pos).X;
  dStack_40 = (this->__Pos).Y;
  bVar3 = false;
  while ((psVar2->planes[1].Flags & 0x1d0U) == 0x100) {
    if (dVar1 < sectorPortals.Array[psVar2->Portals[1]].mPlaneZ) break;
    PosRelative(&local_68,this,(sectorPortals.Array[psVar2->Portals[1]].mDestination)->PortalGroup);
    local_78 = local_68.Z;
    local_48 = local_68.X;
    dStack_40 = local_68.Y;
    psVar2 = P_PointInSector((DVector2 *)&local_68);
    bVar3 = true;
  }
  __return_storage_ptr__->Z = local_78;
  __return_storage_ptr__->X = local_48;
  __return_storage_ptr__->Y = dStack_40;
  if (!bVar3) {
    while ((psVar2->planes[0].Flags & 0x1d0U) == 0x100) {
      if (sectorPortals.Array[psVar2->Portals[0]].mPlaneZ <= dVar1) break;
      PosRelative(&local_68,this,(sectorPortals.Array[psVar2->Portals[0]].mDestination)->PortalGroup
                 );
      local_78 = local_68.Z;
      local_48 = local_68.X;
      dStack_40 = local_68.Y;
      psVar2 = P_PointInSector((DVector2 *)&local_68);
    }
    __return_storage_ptr__->Z = local_78;
    __return_storage_ptr__->X = local_48;
    __return_storage_ptr__->Y = dStack_40;
  }
  if (pSec != (sector_t **)0x0) {
    *pSec = (sector_t *)psVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

DVector3 AActor::GetPortalTransition(double byoffset, sector_t **pSec)
{
	bool moved = false;
	sector_t *sec = Sector;
	double testz = Z() + byoffset;
	DVector3 pos = Pos();

	while (!sec->PortalBlocksMovement(sector_t::ceiling))
	{
		if (testz >= sec->GetPortalPlaneZ(sector_t::ceiling))
		{
			pos = PosRelative(sec->GetOppositePortalGroup(sector_t::ceiling));
			sec = P_PointInSector(pos);
			moved = true;
		}
		else break;
	}
	if (!moved)
	{
		while (!sec->PortalBlocksMovement(sector_t::floor))
		{
			if (testz < sec->GetPortalPlaneZ(sector_t::floor))
			{
				pos = PosRelative(sec->GetOppositePortalGroup(sector_t::floor));
				sec = P_PointInSector(pos);
			}
			else break;
		}
	}
	if (pSec) *pSec = sec;
	return pos;
}